

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O3

void __thiscall Emulator::~Emulator(Emulator *this)

{
  pointer pcVar1;
  Sound_Queue *pSVar2;
  
  this->_vptr_Emulator = (_func_int **)&PTR__Emulator_0011ea28;
  std::thread::join();
  pSVar2 = sound_queue;
  if (sound_queue != (Sound_Queue *)0x0) {
    Sound_Queue::~Sound_Queue(sound_queue);
  }
  operator_delete(pSVar2);
  SDL_FreeSurface(surface);
  SDL_DestroyWindow(window);
  SDL_DestroyRenderer(renderer);
  SDL_Quit();
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Emulator::~Emulator() {
    thread.join();
    delete sound_queue;
    SDL_FreeSurface(surface);
    SDL_DestroyWindow(window);
    SDL_DestroyRenderer(renderer);
    SDL_Quit();
}